

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

iterator __thiscall
google::protobuf::RepeatedField<double>::erase
          (RepeatedField<double> *this,const_iterator first,const_iterator last)

{
  void *__dest;
  void *pvVar1;
  LogMessage *other;
  int iVar2;
  size_t __n;
  LogFinisher local_61;
  LogMessage local_60;
  
  pvVar1 = this->arena_or_elements_;
  if (first != last) {
    __dest = (void *)((long)pvVar1 + (long)(int)((ulong)((long)first - (long)pvVar1) >> 3) * 8);
    __n = (long)pvVar1 + ((long)this->current_size_ * 8 - (long)last);
    if (__n != 0) {
      memmove(__dest,last,__n);
    }
    iVar2 = (int)((long)__dest + (__n - (long)this->arena_or_elements_) >> 3);
    if (this->current_size_ < iVar2) {
      internal::LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x3bd);
      other = internal::LogMessage::operator<<
                        (&local_60,"CHECK failed: (new_size) <= (current_size_): ");
      internal::LogFinisher::operator=(&local_61,other);
      internal::LogMessage::~LogMessage(&local_60);
    }
    if (0 < this->current_size_) {
      this->current_size_ = iVar2;
    }
  }
  return (iterator)
         ((long)(int)((ulong)((long)first - (long)pvVar1) >> 3) * 8 + (long)this->arena_or_elements_
         );
}

Assistant:

inline typename RepeatedField<Element>::iterator RepeatedField<Element>::erase(
    const_iterator first, const_iterator last) {
  size_type first_offset = first - cbegin();
  if (first != last) {
    Truncate(std::copy(last, cend(), begin() + first_offset) - cbegin());
  }
  return begin() + first_offset;
}